

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

void ts_subtree_balance(Subtree self,SubtreePool *pool,TSLanguage *language)

{
  MutableSubtree *pMVar1;
  Subtree SVar2;
  Subtree self_00;
  uint32_t uVar3;
  MutableSubtree MVar4;
  MutableSubtree MVar5;
  uint uVar6;
  Subtree child;
  uint local_48;
  uint32_t i_1;
  uint i;
  uint n;
  Subtree child2;
  Subtree child1;
  MutableSubtree tree;
  TSLanguage *language_local;
  SubtreePool *pool_local;
  Subtree self_local;
  
  (pool->tree_stack).size = 0;
  uVar3 = ts_subtree_child_count(self);
  if ((uVar3 != 0) && ((self.ptr)->ref_count == 1)) {
    array__grow((VoidArray *)&pool->tree_stack,8);
    pMVar1 = (pool->tree_stack).contents;
    uVar6 = (pool->tree_stack).size;
    (pool->tree_stack).size = uVar6 + 1;
    MVar4 = ts_subtree_to_mut_unsafe(self);
    pMVar1[uVar6] = MVar4;
  }
  while ((pool->tree_stack).size != 0) {
    uVar6 = (pool->tree_stack).size - 1;
    (pool->tree_stack).size = uVar6;
    MVar4 = (MutableSubtree)(pool->tree_stack).contents[uVar6].ptr;
    if (((MVar4.ptr)->field_17).field_0.repeat_depth != 0) {
      SVar2 = *((MVar4.ptr)->field_17).field_0.children;
      self_00 = ((MVar4.ptr)->field_17).field_0.children[(MVar4.ptr)->child_count - 1];
      uVar3 = ts_subtree_child_count(SVar2);
      if (((uVar3 != 0) && (uVar3 = ts_subtree_child_count(self_00), uVar3 != 0)) &&
         (((self_00.ptr)->field_17).field_0.repeat_depth <
          ((SVar2.ptr)->field_17).field_0.repeat_depth)) {
        local_48 = ((SVar2.ptr)->field_17).field_0.repeat_depth -
                   ((self_00.ptr)->field_17).field_0.repeat_depth;
        while (local_48 = local_48 >> 1, local_48 != 0) {
          ts_subtree__compress(MVar4,local_48,language,&pool->tree_stack);
        }
      }
    }
    for (child._4_4_ = 0; (uint)child._4_4_ < (MVar4.ptr)->child_count;
        child._4_4_ = child._4_4_ + 1) {
      SVar2 = ((MVar4.ptr)->field_17).field_0.children[(uint)child._4_4_];
      uVar3 = ts_subtree_child_count(SVar2);
      if ((uVar3 != 0) && ((SVar2.ptr)->ref_count == 1)) {
        array__grow((VoidArray *)&pool->tree_stack,8);
        pMVar1 = (pool->tree_stack).contents;
        uVar6 = (pool->tree_stack).size;
        (pool->tree_stack).size = uVar6 + 1;
        MVar5 = ts_subtree_to_mut_unsafe(SVar2);
        pMVar1[uVar6] = MVar5;
      }
    }
  }
  return;
}

Assistant:

void ts_subtree_balance(Subtree self, SubtreePool *pool, const TSLanguage *language) {
  array_clear(&pool->tree_stack);

  if (ts_subtree_child_count(self) > 0 && self.ptr->ref_count == 1) {
    array_push(&pool->tree_stack, ts_subtree_to_mut_unsafe(self));
  }

  while (pool->tree_stack.size > 0) {
    MutableSubtree tree = array_pop(&pool->tree_stack);

    if (tree.ptr->repeat_depth > 0) {
      Subtree child1 = tree.ptr->children[0];
      Subtree child2 = tree.ptr->children[tree.ptr->child_count - 1];
      if (
        ts_subtree_child_count(child1) > 0 &&
        ts_subtree_child_count(child2) > 0 &&
        child1.ptr->repeat_depth > child2.ptr->repeat_depth
      ) {
        unsigned n = child1.ptr->repeat_depth - child2.ptr->repeat_depth;
        for (unsigned i = n / 2; i > 0; i /= 2) {
          ts_subtree__compress(tree, i, language, &pool->tree_stack);
          n -= i;
        }
      }
    }

    for (uint32_t i = 0; i < tree.ptr->child_count; i++) {
      Subtree child = tree.ptr->children[i];
      if (ts_subtree_child_count(child) > 0 && child.ptr->ref_count == 1) {
        array_push(&pool->tree_stack, ts_subtree_to_mut_unsafe(child));
      }
    }
  }
}